

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derTBITEnc(octet *der,u32 tag,octet *val,size_t len)

{
  octet *der_00;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  byte bVar4;
  octet *dest;
  ulong len_00;
  
  sVar1 = derTEnc((octet *)0x0,tag);
  if (sVar1 == 0xffffffffffffffff) {
    return 0xffffffffffffffff;
  }
  len_00 = len + 0xf >> 3;
  sVar2 = derLEnc((octet *)0x0,len_00);
  if (sVar2 == 0xffffffffffffffff) {
LAB_00111876:
    sVar2 = 0xffffffffffffffff;
  }
  else {
    if (der != (octet *)0x0) {
      der_00 = der + sVar1;
      dest = der_00 + sVar2 + 1;
      memMove(dest,val,len + 7 >> 3);
      if ((len & 7) == 0) {
        bVar4 = 0;
      }
      else {
        bVar4 = 8 - (char)(len & 7);
        dest[len >> 3] = dest[len >> 3] & (byte)(-1 << (bVar4 & 0x1f));
      }
      der_00[sVar2] = bVar4;
      sVar3 = derTEnc(der,tag);
      if (sVar3 != sVar1) goto LAB_00111876;
      sVar3 = derLEnc(der_00,len_00);
      if (sVar3 != sVar2) {
        return 0xffffffffffffffff;
      }
    }
    sVar2 = sVar1 + len_00 + sVar2;
  }
  return sVar2;
}

Assistant:

size_t derTBITEnc(octet der[], u32 tag, const octet* val, size_t len)
{
	size_t t_count;
	size_t l_count;
	// кодировать T
	t_count = derTEnc(0, tag);
	if (t_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать L
	l_count = derLEnc(0, (len + 15) / 8);
	if (l_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать
	if (der)
	{
		// V
		memMove(der + t_count + l_count + 1, val, (len + 7) / 8);
		if (len % 8)
		{
			der[t_count + l_count + 1 + len / 8] >>= 8 - len % 8;
			der[t_count + l_count + 1 + len / 8] <<= 8 - len % 8;
			der[t_count + l_count] = 8 - len % 8;
		}
		else
			der[t_count + l_count] = 0;
		// TL
		if (derTEnc(der, tag) != t_count ||
			derLEnc(der + t_count, (len + 15) / 8) != l_count)
			return SIZE_MAX;
	}
	return t_count + l_count + (len + 15) / 8;
}